

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void Map_Remove(Map *tree,void *str,size_t size)

{
  Map *data;
  void *pvVar1;
  byte bVar2;
  long lVar3;
  Stack stk;
  Stack local_40;
  
  Stack_Init(&local_40);
  bVar2 = *str;
  Stack_Push(&local_40,tree);
  lVar3 = 0;
  if (size != 1) {
    do {
      data = tree->delta[*(byte *)((long)str + lVar3)];
      if (data == (Map *)0x0) break;
      if (data->is_final == '\x01') {
        while (local_40.size != 0) {
          Stack_Pop(&local_40);
        }
        bVar2 = *(byte *)((long)str + lVar3 + 1);
      }
      Stack_Push(&local_40,data);
      lVar3 = lVar3 + 1;
      tree = data;
    } while (lVar3 != size - 1);
  }
  if (tree->delta[*(byte *)((long)str + lVar3)] != (Map *)0x0) {
    free(tree->delta[*(byte *)((long)str + lVar3)]);
    if (1 < local_40.size) {
      do {
        pvVar1 = Stack_Pop(&local_40);
        free(pvVar1);
      } while (1 < local_40.size);
    }
    pvVar1 = Stack_Pop(&local_40);
    *(undefined8 *)((long)pvVar1 + (ulong)bVar2 * 8 + 8) = 0;
  }
  return;
}

Assistant:

void Map_Remove(Map *tree, void *str,size_t size)
{
	Stack stk;
	Stack_Init(&stk);
	size_t where;
	char what_to_null=((char*)str)[0];

	Stack_Push(&stk,tree);

	for(where=0;where<size-1 && tree->delta[((unsigned char*)str)[where]]!=NULL;++where)
	{
		tree = tree->delta[((unsigned char*)str)[where]];
		if(tree->is_final==1)
		{
			while(stk.size>0)Stack_Pop(&stk);
			what_to_null=((char*)str)[where+1];
		}
		Stack_Push(&stk,tree);
	}
	if(tree->delta[((unsigned char*)str)[where]] == NULL)return;
	free(tree->delta[((unsigned char*)str)[where]]);
	while(stk.size>1)free(Stack_Pop(&stk));
	tree=(Map*)Stack_Pop(&stk);
	tree->delta[(unsigned char)what_to_null]=NULL;
	
}